

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

Parg * __thiscall OB::Parg::usage(Parg *this,string *_usage)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"  ",&this->name_);
  std::operator+(&bStack_98,&local_38," ");
  std::operator+(&local_78,&bStack_98,_usage);
  std::operator+(&local_58,&local_78,"\n");
  std::__cxx11::string::append((string *)&this->usage_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

Parg& usage(std::string const _usage)
  {
    usage_ += "  " + name_ + " " + _usage + "\n";
    return *this;
  }